

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseStartModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  undefined1 local_90 [8];
  Location loc;
  Var var;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ != Error) {
    GetLocation(&loc,this);
    if ((module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      RVar1 = Expect(this,Start);
      if (RVar1.enum_ != Error) {
        Var::Var(&var);
        RVar1 = ParseVar(this,&var);
        EVar2 = Error;
        if ((RVar1.enum_ != Error) && (RVar1 = Expect(this,Rpar), RVar1.enum_ != Error)) {
          std::make_unique<wabt::StartModuleField,wabt::Var&,wabt::Location&>
                    ((Var *)local_90,&var.loc);
          Module::AppendField(module,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                                      *)local_90);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
          local_90 = (undefined1  [8])0x0;
          EVar2 = Ok;
        }
        Var::~Var(&var);
        return (Result)EVar2;
      }
    }
    else {
      Error(this,0x172e4d);
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseStartModuleField(Module* module) {
  WABT_TRACE(ParseStartModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  if (module->starts.size() > 0) {
    Error(loc, "multiple start sections");
    return Result::Error;
  }
  EXPECT(Start);
  Var var;
  CHECK_RESULT(ParseVar(&var));
  EXPECT(Rpar);
  module->AppendField(std::make_unique<StartModuleField>(var, loc));
  return Result::Ok;
}